

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O2

int GeneratedSaxParser::Utils::toInteger<int,true>
              (ParserChar **buffer,ParserChar *bufferEnd,bool *failed)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  ulong uVar5;
  
  pbVar4 = (byte *)*buffer;
  if ((pbVar4 == (byte *)0x0) || (pbVar4 == (byte *)bufferEnd)) {
    *failed = true;
    return 0;
  }
  do {
    uVar5 = (ulong)*pbVar4;
    if (0x2d < uVar5) goto LAB_00842ccf;
    if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
      if (uVar5 == 0x2b) {
        pbVar4 = pbVar4 + 1;
LAB_00842ccf:
        iVar1 = 1;
      }
      else {
        if (uVar5 != 0x2d) goto LAB_00842ccf;
        pbVar4 = pbVar4 + 1;
        iVar1 = -1;
      }
      iVar3 = 0;
      bVar2 = false;
      goto LAB_00842cd8;
    }
    pbVar4 = pbVar4 + 1;
  } while (pbVar4 != (byte *)bufferEnd);
  goto LAB_00842cab;
LAB_00842cd8:
  if (pbVar4 == (byte *)bufferEnd) goto LAB_00842cfc;
  if (9 < (byte)(*pbVar4 - 0x30)) {
    if (!bVar2) {
      *failed = true;
      *buffer = (ParserChar *)pbVar4;
      return 0;
    }
    *buffer = (ParserChar *)pbVar4;
    *failed = false;
    goto LAB_00842d16;
  }
  iVar3 = iVar3 * 10 + (uint)*pbVar4 + -0x30;
  pbVar4 = pbVar4 + 1;
  bVar2 = true;
  goto LAB_00842cd8;
LAB_00842cfc:
  if (bVar2) {
    *failed = false;
    *buffer = bufferEnd;
LAB_00842d16:
    return iVar3 * iVar1;
  }
LAB_00842cab:
  *failed = true;
  *buffer = bufferEnd;
  return 0;
}

Assistant:

IntegerType Utils::toInteger(const ParserChar** buffer, const ParserChar* bufferEnd, bool& failed)
	{
		const ParserChar* s = *buffer;
		if ( !s )
		{
			failed = true;
			return 0;
		}

		if ( s == bufferEnd )
		{
			failed = true;
			*buffer = bufferEnd;
			return 0;
		}

		// Skip leading white spaces
		while ( isWhiteSpace(*s) )
		{
			++s;
			if ( s == bufferEnd )
			{
				failed = true;
				*buffer = bufferEnd;
				return 0;
			}
		}

		IntegerType value = 0;
		IntegerType sign = 1;
		if ( signedInteger )
		{
			if (*s == '-')
			{
				++s;
				sign = -1;
			}
			else if (*s == '+')
			{
				++s;
			}
		}

		bool digitFound = false;
		while (true)
		{
			if ( s == bufferEnd )
			{
				if (digitFound)
				{
					failed = false;
					*buffer = s;
					if ( signedInteger )
						return value * sign;
					else
						return value;
				}
				else
				{
					failed = true;
					*buffer = s;
					return 0;
				}
			}

			if ( isdigit(*s) )
			{
				value = value * 10 + (*s - '0');
				digitFound = true;
			}
			else
				break;
			++s;
		}
		if ( digitFound )
		{
			*buffer = s;
			failed = false;
			if ( signedInteger )
				return value * sign;
			else
				return value;
		}
		else
		{
			failed = true;
			*buffer = s;
			return 0;
		}
	}